

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VL1NormLocal(N_Vector X,sunindextype local_length,int myid)

{
  uint in_EDX;
  long in_RSI;
  N_Vector in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  sunrealtype val;
  sunrealtype ans;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  int local_4c;
  sunindextype in_stack_ffffffffffffffc0;
  sunindextype in_stack_ffffffffffffffc8;
  N_Vector in_stack_ffffffffffffffd0;
  int local_18;
  
  local_18 = 0;
  set_element_range(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    -((double)(int)in_EDX * 1.0) / (double)in_RSI);
  dVar1 = get_time();
  dVar2 = (double)N_VL1NormLocal(in_RDI);
  sync_device(in_RDI);
  dVar3 = get_time();
  if (0.0 <= dVar2) {
    dVar4 = sqrt(2.220446049250313e-16);
    local_4c = SUNRCompareTol(dVar2,(double)(int)in_EDX,SUB84(dVar4,0));
  }
  else {
    local_4c = 1;
  }
  if (local_4c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VL1NormLocal\n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VL1NormLocal, Proc %d\n",(ulong)in_EDX);
    local_18 = 1;
  }
  dVar1 = max_time(in_RDI,dVar3 - dVar1);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar1,"N_VL1NormLocal");
  }
  return local_18;
}

Assistant:

int Test_N_VL1NormLocal(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, val;

  /* fill vector data */
  val = -(ONE * myid) / local_length;
  set_element_range(X, 0, local_length - 1, val);

  start_time = get_time();
  ans        = N_VL1NormLocal(X);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal myid */
  failure = (ans < ZERO) ? 1
                         : SUNRCompareTol(ans, (sunrealtype)myid,
                                          SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VL1NormLocal, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VL1NormLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VL1NormLocal", maxt);

  return (fails);
}